

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::escapeString(string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  reference pvVar1;
  size_type in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  size_type fnd;
  undefined7 in_stack_ffffffffffffffe8;
  char in_stack_ffffffffffffffef;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
         find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,
                       (char *)fnd,(size_type)unaff_retaddr);
  do {
    if (this == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xffffffffffffffff) {
      return;
    }
    if (this == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_006c078e:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                (unaff_retaddr,in_RDI,(size_type)this,in_stack_ffffffffffffffef);
    }
    else {
      pvVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](this,CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
      if (*pvVar1 != '\\') goto LAB_006c078e;
    }
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str,
                         (char *)fnd,(size_type)unaff_retaddr);
  } while( true );
}

Assistant:

static void escapeString(std::string& str)
{
    auto fnd = str.find_first_of("{}[]()");
    while (fnd != std::string::npos) {
        if (fnd == 0 || str[fnd - 1] != '\\') {
            str.insert(fnd, 1, '\\');
            ++fnd;
        }
        fnd = str.find_first_of("{}[]()", fnd + 1);
    }
}